

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

void __thiscall chrono::ChFunctionRotation_SQUAD::SetClosed(ChFunctionRotation_SQUAD *this,bool mc)

{
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *this_00;
  ChVectorDynamic<> *this_01;
  ChQuaternion<double> *other;
  size_type n;
  long lVar1;
  size_type sVar2;
  long lVar3;
  
  if (this->closed != mc) {
    this_00 = &this->rotations;
    this_01 = &this->knots;
    lVar3 = (long)(this->rotations).
                  super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->rotations).
                  super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = lVar3 >> 5;
    if (mc) {
      sVar2 = lVar1 + 1;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(this_00,sVar2);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,sVar2);
      geometry::ChBasisToolsBspline::ComputeKnotUniform(this_01,1,0.0,1.0);
      other = (this_00->
              super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      ChQuaternion<double>::operator=((ChQuaternion<double> *)(lVar3 + (long)other),other);
    }
    else {
      sVar2 = lVar1 - 1;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(this_00,sVar2);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,sVar2);
      geometry::ChBasisToolsBspline::ComputeKnotUniform(this_01,1,0.0,1.0);
    }
    this->closed = mc;
  }
  return;
}

Assistant:

void ChFunctionRotation_SQUAD::SetClosed(bool mc) {
	if (this->closed == mc)
		return;

	// switch open->closed
	if (mc == true) {
		// add p control points to be wrapped: resize knots and control points
		auto n = this->rotations.size();
		n += 1; 
		this->rotations.resize(n);
		this->knots.setZero(n);
		
		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, 1);
		
		// wrap last control point
		this->rotations[n - 1] = this->rotations[0];
	}
	
	// switch closed->open
	if (mc == false) {
		// remove p control points that was wrapped: resize knots and control points
		auto n = this->rotations.size();
		n -= 1; 
		this->rotations.resize(n);
		this->knots.setZero(n);

		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, 1);
	}

	this->closed = mc;
}